

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_context.c
# Opt level: O0

int extensionSupportedGLX(char *extension)

{
  GLFWbool GVar1;
  char *pcVar2;
  char *extensions;
  int local_4;
  
  pcVar2 = (*_glfw.glx.QueryExtensionsString)(_glfw.x11.display,_glfw.x11.screen);
  if ((pcVar2 == (char *)0x0) ||
     (GVar1 = _glfwStringInExtensionString(extension,extensions), GVar1 == 0)) {
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int extensionSupportedGLX(const char* extension)
{
    const char* extensions =
        glXQueryExtensionsString(_glfw.x11.display, _glfw.x11.screen);
    if (extensions)
    {
        if (_glfwStringInExtensionString(extension, extensions))
            return GLFW_TRUE;
    }

    return GLFW_FALSE;
}